

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::DataPageHeaderV2::read(DataPageHeaderV2 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  ushort *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  int32_t ecast69;
  TType ftype;
  string fname;
  ushort local_b2;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  DataPageHeaderV2 *local_98;
  type local_90;
  int local_8c;
  int32_t *local_88;
  int32_t *local_80;
  int32_t *local_78;
  int32_t *local_70;
  int32_t *local_68;
  bool *local_60;
  Statistics *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->statistics;
  local_60 = &this->is_compressed;
  local_68 = &this->repetition_levels_byte_length;
  local_70 = &this->definition_levels_byte_length;
  local_78 = &this->num_rows;
  local_80 = &this->num_nulls;
  local_88 = &this->num_values;
  local_9c = 0;
  local_ac = 0;
  local_a0 = 0;
  local_b0 = 0;
  local_a4 = 0;
  local_a8 = 0;
  local_98 = this;
  do {
    __nbytes_00 = &local_b2;
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_8c);
    if (local_8c == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((byte)local_a4 & (byte)local_a8 &
           (byte)local_a0 & (byte)local_b0 & (byte)local_9c & (byte)local_ac & 1) == 0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar7[1] = puVar7 + 3;
        puVar7[2] = 0;
        *(undefined1 *)(puVar7 + 3) = 0;
        *puVar7 = &PTR__TException_02474880;
        *(undefined4 *)(puVar7 + 5) = 1;
        __cxa_throw(puVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar2 + iVar1);
    }
    switch(local_b2) {
    case 1:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_8c != 8) goto LAB_01b7a387;
      iVar3 = (*pp_Var6[0x27])(this_00,local_88);
      local_9c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      break;
    case 2:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_8c != 8) goto LAB_01b7a387;
      iVar3 = (*pp_Var6[0x27])(this_00,local_80);
      local_ac = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      break;
    case 3:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_8c != 8) goto LAB_01b7a387;
      iVar3 = (*pp_Var6[0x27])(this_00,local_78);
      local_a0 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      break;
    case 4:
      if (local_8c != 8) goto switchD_01b7a2c1_default;
      iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_90);
      local_98->encoding = local_90;
      local_b0 = (undefined4)CONCAT71((uint7)(uint3)(local_90 >> 8),1);
      break;
    case 5:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_8c != 8) goto LAB_01b7a387;
      iVar3 = (*pp_Var6[0x27])(this_00,local_70);
      local_a4 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      break;
    case 6:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_8c != 8) goto LAB_01b7a387;
      iVar3 = (*pp_Var6[0x27])(this_00,local_68);
      local_a8 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      break;
    case 7:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_8c != 2) goto LAB_01b7a387;
      iVar3 = (*pp_Var6[0x23])(this_00,local_60);
      local_98->__isset = (_DataPageHeaderV2__isset)((byte)local_98->__isset | 1);
      break;
    case 8:
      if (local_8c != 0xc) goto switchD_01b7a2c1_default;
      sVar5 = Statistics::read(local_58,__fd,__buf_00,(size_t)__nbytes_00);
      iVar3 = (int)sVar5;
      local_98->__isset = (_DataPageHeaderV2__isset)((byte)local_98->__isset | 2);
      break;
    default:
switchD_01b7a2c1_default:
      pp_Var6 = this_00->_vptr_TProtocol;
LAB_01b7a387:
      iVar3 = (*pp_Var6[0x2c])(this_00);
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t DataPageHeaderV2::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_num_values = false;
  bool isset_num_nulls = false;
  bool isset_num_rows = false;
  bool isset_encoding = false;
  bool isset_definition_levels_byte_length = false;
  bool isset_repetition_levels_byte_length = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_values);
          isset_num_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_nulls);
          isset_num_nulls = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_rows);
          isset_num_rows = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast69;
          xfer += iprot->readI32(ecast69);
          this->encoding = static_cast<Encoding::type>(ecast69);
          isset_encoding = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->definition_levels_byte_length);
          isset_definition_levels_byte_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->repetition_levels_byte_length);
          isset_repetition_levels_byte_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->is_compressed);
          this->__isset.is_compressed = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->statistics.read(iprot);
          this->__isset.statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_num_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_nulls)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_rows)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_encoding)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_definition_levels_byte_length)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_repetition_levels_byte_length)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}